

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O0

boolean ok_race(int rolenum,int racenum,int gendnum,int alignnum)

{
  ushort local_22;
  int local_20;
  short allow;
  int i;
  int alignnum_local;
  int gendnum_local;
  int racenum_local;
  int rolenum_local;
  
  if ((racenum < 0) || (5 < racenum)) {
    for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
      local_22 = races[local_20].allow;
      if ((-1 < rolenum) && (rolenum < 0xe)) {
        local_22 = local_22 & roles[rolenum].allow;
      }
      if ((((gendnum < 0) || (1 < gendnum)) ||
          (((int)(short)(local_22 & genders[gendnum].allow) & 0xf000U) != 0)) &&
         (((((alignnum < 0 || (2 < alignnum)) || ((local_22 & aligns[alignnum].allow & 7) != 0)) &&
           (((local_22 & 0xff8) != 0 && (((int)(short)local_22 & 0xf000U) != 0)))) &&
          ((local_22 & 7) != 0)))) {
        return '\x01';
      }
    }
    racenum_local._3_1_ = '\0';
  }
  else {
    local_22 = races[racenum].allow;
    if ((-1 < rolenum) && (rolenum < 0xe)) {
      local_22 = local_22 & roles[rolenum].allow;
    }
    if (((gendnum < 0) || (1 < gendnum)) ||
       (((int)(short)(local_22 & genders[gendnum].allow) & 0xf000U) != 0)) {
      if (((alignnum < 0) || (2 < alignnum)) || ((local_22 & aligns[alignnum].allow & 7) != 0)) {
        if ((((local_22 & 0xff8) == 0) || (((int)(short)local_22 & 0xf000U) == 0)) ||
           ((local_22 & 7) == 0)) {
          racenum_local._3_1_ = '\0';
        }
        else {
          racenum_local._3_1_ = '\x01';
        }
      }
      else {
        racenum_local._3_1_ = '\0';
      }
    }
    else {
      racenum_local._3_1_ = '\0';
    }
  }
  return racenum_local._3_1_;
}

Assistant:

boolean ok_race(int rolenum, int racenum, int gendnum, int alignnum)
{
    int i;
    short allow;

    if (racenum >= 0 && racenum < SIZE(races)-1) {
	allow = races[racenum].allow;

	if (rolenum >= 0 && rolenum < SIZE(roles)-1)
	    allow &= roles[rolenum].allow;
	if (gendnum >= 0 && gendnum < ROLE_GENDERS &&
		!(allow & genders[gendnum].allow & ROLE_GENDMASK))
	    return FALSE;
	if (alignnum >= 0 && alignnum < ROLE_ALIGNS &&
		!(allow & aligns[alignnum].allow & ROLE_ALIGNMASK))
	    return FALSE;

	if (!(allow & ROLE_RACEMASK) || !(allow & ROLE_GENDMASK) ||
		!(allow & ROLE_ALIGNMASK))
	    return FALSE;
	return TRUE;
    } else {
	for (i = 0; i < SIZE(races)-1; i++) {
	    allow = races[i].allow;

	    if (rolenum >= 0 && rolenum < SIZE(roles)-1)
		allow &= roles[rolenum].allow;
	    if (gendnum >= 0 && gendnum < ROLE_GENDERS &&
		    !(allow & genders[gendnum].allow & ROLE_GENDMASK))
		continue;
	    if (alignnum >= 0 && alignnum < ROLE_ALIGNS &&
		    !(allow & aligns[alignnum].allow & ROLE_ALIGNMASK))
		continue;

	    if (!(allow & ROLE_RACEMASK) || !(allow & ROLE_GENDMASK) ||
		    !(allow & ROLE_ALIGNMASK))
		continue;
	    return TRUE;
	}
	return FALSE;
    }
}